

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall r_comp::Compiler::expression_head(Compiler *this,Ptr *node,Class *p,ReturnType t)

{
  bool bVar1;
  shared_ptr<r_comp::RepliStruct> local_80;
  shared_ptr<r_comp::RepliStruct> local_70;
  shared_ptr<r_comp::RepliStruct> local_60 [2];
  shared_ptr<r_comp::RepliStruct> local_40;
  ReturnType local_2c;
  Class *pCStack_28;
  ReturnType t_local;
  Class *p_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_2c = t;
  pCStack_28 = p;
  p_local = (Class *)node;
  node_local = (Ptr *)this;
  if (t == ANY) {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_40,node);
    bVar1 = object(this,&local_40,pCStack_28);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_40);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(local_60,node);
      bVar1 = marker(this,local_60,pCStack_28);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_60);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_70,node);
        bVar1 = op(this,&local_70,pCStack_28,ANY);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_70);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
    }
  }
  else {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_80,node);
    bVar1 = op(this,&local_80,pCStack_28,local_2c);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_80);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Compiler::expression_head(RepliStruct::Ptr node, Class &p, const ReturnType t)
{
    if (t == ANY) {
        if (!object(node, p)) {
            if (!marker(node, p)) {
                if (!op(node, p, ANY)) {
                    return false;
                }
            }
        }
    } else if (!op(node, p, t)) {
        return false;
    }

    return true;
}